

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O0

void textui_cmd_ignore_menu(object *obj)

{
  ego_item *peVar1;
  char *pcVar2;
  _Bool _Var3;
  uint8_t uVar4;
  ignore_type_t iVar5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  _Bool local_1a1;
  wchar_t ignore_type;
  undefined1 auStack_194 [3];
  uint8_t ignore_value;
  char tmp_1 [80];
  ego_item *ego;
  ego_desc choice;
  char tmp [70];
  _Bool ignored;
  wchar_t type;
  undefined1 auStack_d0 [3];
  uint8_t value;
  wchar_t selected;
  region r;
  menu_conflict2 *m;
  char out_val [160];
  object *obj_local;
  
  if (obj != (object *)0x0) {
    r._8_8_ = menu_dynamic_new();
    ((menu_conflict *)r._8_8_)->selections = "abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ";
    if ((obj->known->notice & 4) == 0) {
      menu_dynamic_add((menu_conflict *)r._8_8_,"This item only",0);
    }
    else {
      menu_dynamic_add((menu_conflict *)r._8_8_,"Unignore this item",1);
    }
    _Var3 = ignore_tval((uint)obj->tval);
    if ((_Var3) &&
       ((obj->artifact == (artifact *)0x0 || (_Var3 = object_flavor_is_aware(obj), !_Var3)))) {
      _Var3 = kind_is_ignored_aware(obj->kind);
      local_1a1 = true;
      if (!_Var3) {
        local_1a1 = kind_is_ignored_unaware(obj->kind);
      }
      object_desc((char *)&choice.short_name,0x46,obj,0x208,player);
      if (local_1a1 == false) {
        strnfmt((char *)&m,0xa0,"All %s",&choice.short_name);
        menu_dynamic_add((menu_conflict *)r._8_8_,(char *)&m,2);
      }
      else {
        strnfmt((char *)&m,0xa0,"Unignore all %s",&choice.short_name);
        menu_dynamic_add((menu_conflict *)r._8_8_,(char *)&m,3);
      }
    }
    iVar5 = ignore_type_of(obj);
    if ((obj->known->ego != (ego_item *)0x0) && (iVar5 != ITYPE_MAX)) {
      peVar1 = obj->ego;
      memset(&ignore_type,0,0x50);
      ego._0_2_ = (short)peVar1->eidx;
      ego._2_2_ = (ushort)iVar5;
      choice._0_8_ = (long)"\a" + 1;
      ego_item_name((char *)&ignore_type,0x50,(ego_desc *)&ego);
      _Var3 = ego_is_ignored((int)(short)ego,(uint)ego._2_2_);
      if (_Var3) {
        strnfmt((char *)&m,0xa0,"Unignore all %s",auStack_194);
        menu_dynamic_add((menu_conflict *)r._8_8_,(char *)&m,5);
      }
      else {
        strnfmt((char *)&m,0xa0,"All %s",auStack_194);
        menu_dynamic_add((menu_conflict *)r._8_8_,(char *)&m,4);
      }
    }
    ignored = (_Bool)ignore_level_of(obj);
    _Var3 = tval_is_jewelry(obj);
    if ((_Var3) && (uVar4 = ignore_level_of(obj), uVar4 != '\x01')) {
      ignored = true;
    }
    if ((ignored != true) && (iVar5 != ITYPE_MAX)) {
      pcVar2 = quality_values[ignored].name;
      pcVar7 = ignore_name_for_type(iVar5);
      strnfmt((char *)&m,0xa0,"All %s %s",pcVar2,pcVar7);
      menu_dynamic_add((menu_conflict *)r._8_8_,(char *)&m,6);
    }
    sVar8 = menu_dynamic_longest_entry((menu_conflict *)r._8_8_);
    r.col = (int)sVar8 + L'\x05';
    _auStack_d0 = 0x50 - r.col;
    selected = L'\x01';
    r.row = *(wchar_t *)(r._8_8_ + 0x70);
    screen_save();
    menu_layout((menu_conflict *)r._8_8_,(region_conflict *)auStack_d0);
    region_erase_bordered((region_conflict *)auStack_d0);
    prt("(Enter to select, ESC) Ignore:",L'\0',L'\0');
    iVar6 = menu_dynamic_select((menu_conflict *)r._8_8_);
    screen_load();
    if (iVar6 == 0) {
      obj->known->notice = obj->known->notice | 4;
    }
    else if (iVar6 == 1) {
      obj->known->notice = obj->known->notice & 0xfb;
    }
    else if (iVar6 == 2) {
      object_ignore_flavor_of(obj);
    }
    else if (iVar6 == 3) {
      kind_ignore_clear(obj->kind);
    }
    else if (iVar6 == 4) {
      ego_ignore(obj);
    }
    else if (iVar6 == 5) {
      ego_ignore_clear(obj);
    }
    else if (iVar6 == 6) {
      uVar4 = ignore_level_of(obj);
      iVar5 = ignore_type_of(obj);
      ignore_level[(int)iVar5] = uVar4;
    }
    player->upkeep->notice = player->upkeep->notice | 2;
    menu_dynamic_free((menu_conflict *)r._8_8_);
  }
  return;
}

Assistant:

void textui_cmd_ignore_menu(struct object *obj)
{
	char out_val[160];

	struct menu *m;
	region r;
	int selected;
	uint8_t value;
	int type;

	if (!obj)
		return;

	m = menu_dynamic_new();
	m->selections = all_letters_nohjkl;

	/* Basic ignore option */
	if (!(obj->known->notice & OBJ_NOTICE_IGNORE)) {
		menu_dynamic_add(m, "This item only", IGNORE_THIS_ITEM);
	} else {
		menu_dynamic_add(m, "Unignore this item", UNIGNORE_THIS_ITEM);
	}

	/* Flavour-aware ignore */
	if (ignore_tval(obj->tval) &&
			(!obj->artifact || !object_flavor_is_aware(obj))) {
		bool ignored = kind_is_ignored_aware(obj->kind) ||
				kind_is_ignored_unaware(obj->kind);

		char tmp[70];
		object_desc(tmp, sizeof(tmp), obj,
			ODESC_NOEGO | ODESC_BASE | ODESC_PLURAL, player);
		if (!ignored) {
			strnfmt(out_val, sizeof out_val, "All %s", tmp);
			menu_dynamic_add(m, out_val, IGNORE_THIS_FLAVOR);
		} else {
			strnfmt(out_val, sizeof out_val, "Unignore all %s", tmp);
			menu_dynamic_add(m, out_val, UNIGNORE_THIS_FLAVOR);
		}
	}

	type = ignore_type_of(obj);

	/* Ego ignoring */
	if (obj->known->ego && type != ITYPE_MAX) {
		struct ego_desc choice;
		struct ego_item *ego = obj->ego;
		char tmp[80] = "";

		choice.e_idx = ego->eidx;
		choice.itype = type;
		choice.short_name = "";
		(void) ego_item_name(tmp, sizeof(tmp), &choice);
		if (!ego_is_ignored(choice.e_idx, choice.itype)) {
			strnfmt(out_val, sizeof out_val, "All %s", tmp + 4);
			menu_dynamic_add(m, out_val, IGNORE_THIS_EGO);
		} else {
			strnfmt(out_val, sizeof out_val, "Unignore all %s", tmp + 4);
			menu_dynamic_add(m, out_val, UNIGNORE_THIS_EGO);
		}
	}

	/* Quality ignoring */
	value = ignore_level_of(obj);

	if (tval_is_jewelry(obj) &&	ignore_level_of(obj) != IGNORE_BAD)
		value = IGNORE_MAX;

	if (value != IGNORE_MAX && type != ITYPE_MAX) {
		strnfmt(out_val, sizeof out_val, "All %s %s",
				quality_values[value].name, ignore_name_for_type(type));

		menu_dynamic_add(m, out_val, IGNORE_THIS_QUALITY);
	}

	/* Work out display region */
	r.width = menu_dynamic_longest_entry(m) + 3 + 2; /* +3 for tag, 2 for pad */
	r.col = 80 - r.width;
	r.row = 1;
	r.page_rows = m->count;

	screen_save();
	menu_layout(m, &r);
	region_erase_bordered(&r);

	prt("(Enter to select, ESC) Ignore:", 0, 0);
	selected = menu_dynamic_select(m);

	screen_load();

	if (selected == IGNORE_THIS_ITEM) {
		obj->known->notice |= OBJ_NOTICE_IGNORE;
	} else if (selected == UNIGNORE_THIS_ITEM) {
		obj->known->notice &= ~(OBJ_NOTICE_IGNORE);
	} else if (selected == IGNORE_THIS_FLAVOR) {
		object_ignore_flavor_of(obj);
	} else if (selected == UNIGNORE_THIS_FLAVOR) {
		kind_ignore_clear(obj->kind);
	} else if (selected == IGNORE_THIS_EGO) {
		ego_ignore(obj);
	} else if (selected == UNIGNORE_THIS_EGO) {
		ego_ignore_clear(obj);
	} else if (selected == IGNORE_THIS_QUALITY) {
		uint8_t ignore_value = ignore_level_of(obj);
		int ignore_type = ignore_type_of(obj);

		ignore_level[ignore_type] = ignore_value;
	}

	player->upkeep->notice |= PN_IGNORE;

	menu_dynamic_free(m);
}